

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int wally_varbuff_to_bytes
              (uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len,size_t *written)

{
  leint16_t tmp;
  long lVar1;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (bytes_out == (uchar *)0x0 || (bytes_len == 0) == (bytes != (uchar *)0x0)) {
    return -2;
  }
  if (bytes_len < 0xfd) {
    if (len <= bytes_len || written == (size_t *)0x0) {
      return -2;
    }
    *bytes_out = (uchar)bytes_len;
    lVar1 = 1;
    if (bytes_len == 0) goto LAB_0010d65e;
  }
  else {
    lVar1 = 3;
    if (0xffff < bytes_len) {
      lVar1 = (ulong)(bytes_len >> 0x20 != 0) * 4 + 5;
    }
    if (written == (size_t *)0x0) {
      return -2;
    }
    if (len < lVar1 + bytes_len) {
      return -2;
    }
    if (bytes_len < 0x10000) {
      *bytes_out = 0xfd;
      *(short *)(bytes_out + 1) = (short)bytes_len;
      lVar1 = 3;
    }
    else if (bytes_len >> 0x20 == 0) {
      *bytes_out = 0xfe;
      *(int *)(bytes_out + 1) = (int)bytes_len;
      lVar1 = 5;
    }
    else {
      *bytes_out = 0xff;
      *(size_t *)(bytes_out + 1) = bytes_len;
      lVar1 = 9;
    }
  }
  memcpy(bytes_out + lVar1,bytes,bytes_len);
LAB_0010d65e:
  *written = lVar1 + bytes_len;
  return 0;
}

Assistant:

int wally_varbuff_to_bytes(const unsigned char *bytes, size_t bytes_len,
                           unsigned char *bytes_out, size_t len, size_t *written)
{
    if (written)
        *written = 0;
    if (BYTES_INVALID(bytes, bytes_len) || !bytes_out ||
        len < varint_get_length(bytes_len) + bytes_len || !written)
        return WALLY_EINVAL;
    *written = varbuff_to_bytes(bytes, bytes_len, bytes_out);
    return WALLY_OK;
}